

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O0

Var Js::TaggedInt::DecrementUnderflowHelper(ScriptContext *scriptContext)

{
  Var pvVar1;
  ScriptContext *scriptContext_local;
  
  pvVar1 = JavascriptNumber::New(-2147483649.0,scriptContext);
  return pvVar1;
}

Assistant:

_NOINLINE Var __stdcall TaggedInt::DecrementUnderflowHelper(ScriptContext* scriptContext)
    {
        return JavascriptNumber::New( k_nMinValue - 1.0, scriptContext );
    }